

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guarded.hpp
# Opt level: O2

shared_handle __thiscall
gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::try_lock_shared
          (cow_guarded<int,_std::timed_mutex> *this)

{
  int *piVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  ulong uVar2;
  shared_handle sVar3;
  
  (this->m_data).m_left.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_data).m_left.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar2 = (ulong)((byte)~*(byte *)(in_RSI + 0x21) & 1);
  LOCK();
  piVar1 = (int *)(in_RSI + 0x24 + uVar2 * 4);
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  std::__shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2> *)
             ((ulong)(((byte)~*(byte *)(in_RSI + 0x20) & 1) << 4) + in_RSI));
  LOCK();
  piVar1 = (int *)(in_RSI + 0x24 + uVar2 * 4);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  sVar3.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_handle)sVar3.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto cow_guarded<T, M>::try_lock_shared() const -> shared_handle
{
    shared_handle retval;

    auto slock = m_data.try_lock_shared();
    if (slock) {
        retval = *slock;
    }

    return retval;
}